

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O3

void get_mon_num_prep(_func__Bool_monster_race_ptr *get_mon_num_hook)

{
  _Bool _Var1;
  alloc_entry *paVar2;
  undefined4 uVar3;
  alloc_entry *paVar4;
  long lVar5;
  long lVar6;
  
  if (0 < alloc_race_size) {
    lVar5 = 0xc;
    lVar6 = 0;
    paVar4 = alloc_race_table;
    do {
      paVar2 = paVar4;
      if (get_mon_num_hook == (_func__Bool_monster_race_ptr *)0x0) {
LAB_0017af98:
        uVar3 = *(undefined4 *)((long)paVar4 + lVar5 + -4);
      }
      else {
        _Var1 = (*get_mon_num_hook)(r_info + *(int *)((long)paVar4 + lVar5 + -0xc));
        uVar3 = 0;
        paVar2 = alloc_race_table;
        if (_Var1) goto LAB_0017af98;
      }
      *(undefined4 *)((long)&paVar4->index + lVar5) = uVar3;
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x14;
      paVar4 = paVar2;
    } while (lVar6 < alloc_race_size);
  }
  return;
}

Assistant:

void get_mon_num_prep(bool (*get_mon_num_hook)(struct monster_race *race))
{
	int i;

	/* Scan the allocation table */
	for (i = 0; i < alloc_race_size; i++) {
		alloc_entry *entry = &alloc_race_table[i];

		/* Check the restriction, if any */
		if (!get_mon_num_hook || (*get_mon_num_hook)(&r_info[entry->index])) {
			/* Accept this monster */
			entry->prob2 = entry->prob1;

		} else {
			/* Do not use this monster */
			entry->prob2 = 0;
		}
	}
}